

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_event_loop.cpp
# Opt level: O3

void __thiscall cancel_handler::operator()(cancel_handler *this,error_code *e)

{
  cancel_handler func;
  long *plVar1;
  callback<void_()> cStack_18;
  
  if ((e->_M_cat != booster::aio::aio_error_cat) || (e->_M_value != 1)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Fail: ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "e==booster::system::error_code(booster::aio::aio_error::canceled,booster::aio::aio_error_cat)"
               ,0x5d);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," at ",4);
    plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cerr,0x82);
    std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
    std::ostream::put((char)plVar1);
    std::ostream::flush();
    return_code = 1;
  }
  cancel_called = cancel_called + 1;
  func = (cancel_handler)this->srv;
  booster::callback<void_()>::callback<cancel_handler>(&cStack_18,func);
  booster::aio::io_service::post((callback *)func.srv);
  booster::intrusive_ptr<booster::callable<void_()>_>::~intrusive_ptr(&cStack_18.call_ptr);
  return;
}

Assistant:

void operator()(booster::system::error_code const &e) const
	{
		TEST(e==booster::system::error_code(booster::aio::aio_error::canceled,booster::aio::aio_error_cat));
		cancel_called ++;
		srv->post(*this);
	}